

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall glslang::TIntermediate::inOutLocationCheck(TIntermediate *this,TInfoSink *infoSink)

{
  byte bVar1;
  int iVar2;
  TIntermAggregate *pTVar3;
  undefined4 extraout_var;
  long *plVar4;
  long lVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  
  pTVar3 = findLinkerObjects(this);
  iVar2 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar3);
  uVar7 = 0;
  iVar6 = 0;
  bVar1 = 0;
  while( true ) {
    lVar5 = *(long *)(CONCAT44(extraout_var,iVar2) + 8);
    if ((ulong)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) - lVar5 >> 3) <= uVar7) break;
    plVar4 = (long *)(**(code **)(**(long **)(lVar5 + uVar7 * 8) + 0x18))();
    plVar4 = (long *)(**(code **)(*plVar4 + 0xf0))(plVar4);
    lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
    if ((this->language == EShLangFragment) && (*(short *)(lVar5 + 8) == 4)) {
      iVar6 = iVar6 + 1;
      bVar1 = bVar1 | (*(ulong *)(lVar5 + 0x1c) & 0xff000000007fff) == 0xff000000004fff;
    }
    uVar7 = uVar7 + 1;
  }
  if ((bool)((1 < iVar6 && this->profile == EEsProfile) & bVar1)) {
    error(this,infoSink,
          "when more than one fragment shader output, all must have location qualifiers",
          EShLangCount);
    return;
  }
  return;
}

Assistant:

void TIntermediate::inOutLocationCheck(TInfoSink& infoSink)
{
    // ES 3.0 requires all outputs to have location qualifiers if there is more than one output
    bool fragOutWithNoLocation = false;
    int numFragOut = 0;

    // TODO: linker functionality: location collision checking

    TIntermSequence& linkObjects = findLinkerObjects()->getSequence();
    for (size_t i = 0; i < linkObjects.size(); ++i) {
        const TType& type = linkObjects[i]->getAsTyped()->getType();
        const TQualifier& qualifier = type.getQualifier();
        if (language == EShLangFragment) {
            if (qualifier.storage == EvqVaryingOut && qualifier.builtIn == EbvNone) {
                ++numFragOut;
                if (!qualifier.hasAnyLocation())
                    fragOutWithNoLocation = true;
            }
        }
    }

    if (isEsProfile()) {
        if (numFragOut > 1 && fragOutWithNoLocation)
            error(infoSink, "when more than one fragment shader output, all must have location qualifiers");
    }
}